

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86.cpp
# Opt level: O3

int __thiscall ncnn::Deconvolution_x86::create_pipeline(Deconvolution_x86 *this,Option *opt)

{
  int *piVar1;
  int _h;
  _func_int **pp_Var2;
  Layer *pLVar3;
  _func_int *p_Var4;
  int i;
  long lVar5;
  ulong uVar6;
  int k;
  ulong uVar7;
  undefined4 *puVar8;
  int _w;
  ulong uVar9;
  undefined4 *puVar10;
  undefined4 *puVar11;
  void *pvVar12;
  ulong uVar13;
  undefined4 *puVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  undefined4 *puVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ParamDict pd_5;
  ParamDict pd;
  ParamDict local_138;
  Mat local_128;
  Mat local_d8;
  void *local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  void *local_58;
  ulong local_50;
  _func_int **local_48;
  ModelBinFromMatArray local_40;
  
  pp_Var2 = this->_vptr_Deconvolution_x86;
  p_Var4 = pp_Var2[-3];
  switch(*(undefined4 *)(&this->field_0x114 + (long)p_Var4)) {
  case 1:
    pLVar3 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_128);
    break;
  case 2:
    pLVar3 = create_layer(0x1a);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,**(float **)(&this->field_0x118 + (long)p_Var4));
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_128);
    goto LAB_0026f2ff;
  case 3:
    pLVar3 = create_layer(0x36);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,**(float **)(&this->field_0x118 + (long)p_Var4));
    ParamDict::set((ParamDict *)&local_128,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var4) + 4));
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_128);
    goto LAB_0026f2ff;
  case 4:
    pLVar3 = create_layer(0x1e);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_128);
    break;
  case 5:
    pLVar3 = create_layer(0x47);
    ParamDict::ParamDict((ParamDict *)&local_128);
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_128);
    break;
  case 6:
    pLVar3 = create_layer(0x43);
    ParamDict::ParamDict((ParamDict *)&local_128);
    ParamDict::set((ParamDict *)&local_128,0,**(float **)(&this->field_0x118 + (long)p_Var4));
    ParamDict::set((ParamDict *)&local_128,1,
                   *(float *)(*(long *)(&this->field_0x118 + (long)p_Var4) + 4));
    (*pLVar3->_vptr_Layer[2])(pLVar3,&local_128);
LAB_0026f2ff:
    ParamDict::~ParamDict((ParamDict *)&local_128);
    goto LAB_0026f30e;
  default:
    pLVar3 = (Layer *)0x0;
    goto LAB_0026f322;
  }
  ParamDict::~ParamDict((ParamDict *)&local_128);
LAB_0026f30e:
  (*pLVar3->_vptr_Layer[4])(pLVar3,opt);
  pp_Var2 = this->_vptr_Deconvolution_x86;
LAB_0026f322:
  this->activation = pLVar3;
  p_Var4 = pp_Var2[-3];
  uVar9 = (long)*(int *)(&this->field_0xd8 + (long)p_Var4) *
          (long)*(int *)(&this->field_0xd4 + (long)p_Var4);
  _w = (int)uVar9;
  uVar21 = (long)*(int *)(&this->field_0x110 + (long)p_Var4) / (long)_w;
  uVar21 = (long)((ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff) /
           (long)(int)*(uint *)(&this->field_0xd0 + (long)p_Var4);
  _h = (int)uVar21;
  uVar17 = 1;
  uVar6 = 1;
  if (opt->use_packing_layout == true) {
    uVar6 = (ulong)((uint)((uVar21 & 3) == 0) * 3 + 1);
    uVar17 = (ulong)((uint)((*(uint *)(&this->field_0xd0 + (long)p_Var4) & 3) == 0) * 3 + 1);
  }
  local_80 = uVar17;
  local_70 = uVar9;
  if (opt->use_sgemm_convolution == true) {
    pLVar3 = create_layer(0x4a);
    this->gemm = pLVar3;
    ParamDict::ParamDict(&local_138);
    uVar9 = local_80;
    ParamDict::set(&local_138,2,1);
    ParamDict::set(&local_138,3,0);
    ParamDict::set(&local_138,4,1);
    ParamDict::set(&local_138,5,0);
    ParamDict::set(&local_138,6,1);
    ParamDict::set(&local_138,7,
                   *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) * _w);
    ParamDict::set(&local_138,8,0);
    ParamDict::set(&local_138,9,_h);
    ParamDict::set(&local_138,10,-1);
    ParamDict::set(&local_138,0xb,0);
    ParamDict::set(&local_138,0xc,(int)uVar9);
    (*this->gemm->_vptr_Layer[2])(this->gemm,&local_138);
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    Mat::reshape(&local_d8,(Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86[-3]),_w,
                 _h,*(int *)&((Mat *)(&this->field_0x160 + (long)this->_vptr_Deconvolution_x86[-3]))
                             [-2].data,(Allocator *)0x0);
    Mat::create(&local_128,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) * _w,_h,4,
                (Allocator *)0x0);
    if (0 < _h) {
      local_78 = (long)local_128.w *
                 CONCAT44(local_128.elemsize._4_4_,(undefined4)local_128.elemsize);
      local_88 = local_128.data;
      pp_Var2 = this->_vptr_Deconvolution_x86;
      uVar17 = uVar9 & 0xffffffff;
      p_Var4 = pp_Var2[-3];
      uVar13 = 0;
      uVar6 = uVar9;
      do {
        if ((int)uVar6 <= *(int *)(&this->field_0xd0 + (long)p_Var4)) {
          puVar18 = (undefined4 *)
                    (CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * uVar13 *
                     (long)local_d8.w + (long)local_d8.data);
          lVar20 = CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize) * local_d8.cstep;
          puVar14 = (undefined4 *)(local_78 * uVar13 + (long)local_128.data);
          lVar5 = 0;
          do {
            if (0 < (int)local_70) {
              uVar7 = 0;
              uVar6 = uVar17;
              puVar8 = puVar18;
              puVar11 = puVar18;
              do {
                do {
                  *puVar14 = *puVar8;
                  puVar14 = puVar14 + 1;
                  uVar6 = uVar6 - 1;
                  puVar8 = (undefined4 *)((long)puVar8 + lVar20);
                } while (uVar6 != 0);
                uVar7 = uVar7 + 1;
                puVar8 = puVar11 + 1;
                uVar6 = uVar17;
                puVar11 = puVar8;
              } while (uVar7 != (local_70 & 0xffffffff));
              p_Var4 = pp_Var2[-3];
            }
            lVar5 = lVar5 + uVar17;
            puVar18 = (undefined4 *)((long)puVar18 + lVar20 * uVar17);
          } while ((long)(lVar5 + (ulong)((int)uVar9 - 1)) <
                   (long)*(int *)(&this->field_0xd0 + (long)p_Var4));
        }
        uVar13 = uVar13 + 1;
        uVar6 = local_80;
      } while (uVar13 != (uVar21 & 0xffffffff));
    }
    piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + 1;
      UNLOCK();
    }
    local_d8.data = local_128.data;
    local_d8.refcount._0_4_ = local_128.refcount._0_4_;
    local_d8.refcount._4_4_ = local_128.refcount._4_4_;
    local_d8.elemsize._0_4_ = (undefined4)local_128.elemsize;
    local_d8.elemsize._4_4_ = local_128.elemsize._4_4_;
    local_d8.elempack = local_128.elempack;
    local_d8.allocator = local_128.allocator;
    local_d8.dims = local_128.dims;
    local_d8.w = local_128.w;
    local_d8.h = local_128.h;
    local_d8.d = local_128.d;
    local_d8.c = local_128.c;
    local_d8.cstep = local_128.cstep;
    pLVar3 = this->gemm;
    ModelBinFromMatArray::ModelBinFromMatArray(&local_40,&local_d8);
    (*pLVar3->_vptr_Layer[3])(pLVar3,&local_40);
    ModelBinFromMatArray::~ModelBinFromMatArray(&local_40);
    (*this->gemm->_vptr_Layer[4])(this->gemm,opt);
    piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    ParamDict::~ParamDict(&local_138);
  }
  else {
    local_128.cstep = 0;
    local_128.data = (void *)0x0;
    local_128.refcount._0_4_ = 0;
    local_128.refcount._4_4_ = 0;
    local_128.elemsize._0_4_ = 0;
    local_128.elemsize._4_4_ = 0;
    local_128.elempack = 0;
    local_128.allocator = (Allocator *)0x0;
    local_128.dims = 0;
    local_128.w = 0;
    local_128.h = 0;
    local_128.d = 0;
    local_128.c = 0;
    iVar15 = 0;
    local_68 = uVar6;
    Mat::create(&local_128,*(int *)(&this->field_0x18c + (long)p_Var4),4,(Allocator *)0x0);
    pp_Var2 = this->_vptr_Deconvolution_x86;
    p_Var4 = pp_Var2[-3];
    uVar21 = uVar9 & 0xffffffff;
    if (0 < *(int *)(&this->field_0xd0 + (long)p_Var4) * _h) {
      lVar5 = *(long *)(&this->field_0x160 + (long)p_Var4);
      puVar14 = (undefined4 *)((long)local_128.data + uVar9 * 4 + -4);
      do {
        if (0 < _w) {
          uVar6 = 0;
          puVar18 = puVar14;
          do {
            *puVar18 = *(undefined4 *)(lVar5 + uVar6 * 4);
            uVar6 = uVar6 + 1;
            puVar18 = puVar18 + -1;
          } while (uVar21 != uVar6);
          p_Var4 = pp_Var2[-3];
        }
        iVar15 = iVar15 + 1;
        lVar5 = lVar5 + uVar9 * 4;
        puVar14 = puVar14 + uVar9;
      } while (iVar15 < *(int *)(&this->field_0xd0 + (long)p_Var4) * _h);
    }
    Mat::reshape(&local_d8,&local_128,_w,_h,*(int *)(&this->field_0xd0 + (long)p_Var4),
                 (Allocator *)0x0);
    uVar6 = local_68;
    iVar15 = (int)local_68;
    iVar16 = (int)uVar17;
    Mat::create(&this->weight_data_tm,_w,_h / iVar15,
                *(int *)(&this->field_0xd0 + (long)this->_vptr_Deconvolution_x86[-3]) / iVar16,
                (ulong)(uint)(iVar15 * iVar16 * 4),iVar15 * iVar16,(Allocator *)0x0);
    local_48 = this->_vptr_Deconvolution_x86;
    p_Var4 = local_48[-3];
    if (iVar16 <= *(int *)(&this->field_0xd0 + (long)p_Var4)) {
      local_50 = (ulong)(iVar16 - 1);
      local_58 = (this->weight_data_tm).data;
      local_60 = (this->weight_data_tm).cstep * (this->weight_data_tm).elemsize;
      uVar7 = uVar6 & 0xffffffff;
      local_78 = (long)_h - (ulong)(iVar15 - 1);
      pvVar12 = (void *)0x0;
      uVar13 = uVar17;
      do {
        if ((int)uVar6 <= _h) {
          puVar14 = (undefined4 *)
                    ((((ulong)pvVar12 & 0xffffffff) / (uVar13 & 0xffffffff)) * local_60 +
                    (long)local_58);
          lVar20 = local_d8.cstep * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize);
          puVar18 = (undefined4 *)(lVar20 * (long)pvVar12 + (long)local_d8.data);
          lVar5 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(undefined4)local_d8.elemsize)
          ;
          lVar19 = 0;
          do {
            if (0 < (int)uVar9) {
              uVar9 = 0;
              puVar8 = puVar18;
              do {
                uVar13 = 0;
                puVar11 = puVar8;
                uVar6 = uVar17;
                puVar10 = puVar8;
                do {
                  do {
                    *puVar14 = *puVar11;
                    puVar14 = puVar14 + 1;
                    uVar6 = uVar6 - 1;
                    puVar11 = (undefined4 *)((long)puVar11 + lVar20);
                  } while (uVar6 != 0);
                  uVar13 = uVar13 + 1;
                  puVar11 = (undefined4 *)((long)puVar10 + lVar5);
                  uVar6 = uVar17;
                  puVar10 = puVar11;
                } while (uVar13 != uVar7);
                uVar9 = uVar9 + 1;
                puVar8 = puVar8 + 1;
              } while (uVar9 != uVar21);
            }
            lVar19 = lVar19 + uVar7;
            puVar18 = (undefined4 *)((long)puVar18 + lVar5 * uVar7);
            uVar9 = local_70;
          } while (lVar19 < local_78);
          p_Var4 = local_48[-3];
          uVar6 = local_68;
          uVar13 = local_80;
          local_88 = pvVar12;
        }
        pvVar12 = (void *)((long)pvVar12 + uVar17);
      } while ((long)((long)pvVar12 + local_50) < (long)*(int *)(&this->field_0xd0 + (long)p_Var4));
    }
    piVar1 = (int *)CONCAT44(local_d8.refcount._4_4_,local_d8.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_d8.allocator == (Allocator *)0x0) {
          if (local_d8.data != (void *)0x0) {
            free(local_d8.data);
          }
        }
        else {
          (*(local_d8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_128.refcount._4_4_,local_128.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_128.allocator == (Allocator *)0x0) {
          if (local_128.data != (void *)0x0) {
            free(local_128.data);
          }
        }
        else {
          (*(local_128.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  if (opt->lightmode == true) {
    p_Var4 = this->_vptr_Deconvolution_x86[-3];
    piVar1 = *(int **)(&this->field_0x168 + (long)p_Var4);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (*(long **)(&this->field_0x180 + (long)p_Var4) == (long *)0x0) {
          if (*(void **)(&this->field_0x160 + (long)p_Var4) != (void *)0x0) {
            free(*(void **)(&this->field_0x160 + (long)p_Var4));
          }
        }
        else {
          (**(code **)(**(long **)(&this->field_0x180 + (long)p_Var4) + 0x18))();
        }
      }
    }
    *(undefined8 *)(&this->field_0x1a0 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x16c + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x174 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x160 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x168 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x188 + (long)p_Var4) = 0;
    *(undefined8 *)(&this->field_0x190 + (long)p_Var4) = 0;
    *(undefined4 *)(&this->field_0x198 + (long)p_Var4) = 0;
  }
  return 0;
}

Assistant:

int Deconvolution_x86::create_pipeline(const Option& opt)
{
    activation = create_activation_layer(activation_type, activation_params, opt);

    const int maxk = kernel_w * kernel_h;
    int num_input = weight_data_size / maxk / num_output;

    int elempack = 1;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        elempack = num_input % 16 == 0 ? 16 : num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        elempack = num_input % 8 == 0 ? 8 : num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        elempack = num_input % 4 == 0 ? 4 : 1;
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (opt.use_sgemm_convolution)
    {
        const int maxk = kernel_w * kernel_h;

        gemm = ncnn::create_layer(ncnn::LayerType::Gemm);

        ncnn::ParamDict pd;
        pd.set(2, 1);                 // transA
        pd.set(3, 0);                 // transB
        pd.set(4, 1);                 // constantA
        pd.set(5, 0);                 // constantB
        pd.set(6, 1);                 // constantC
        pd.set(7, maxk * num_output); // M = maxk*num_output
        pd.set(8, 0);                 // N = size
        pd.set(9, num_input);         // K = inch
        pd.set(10, -1);               // constant_broadcast_type_C = null
        pd.set(11, 0);                // output_N1M
        pd.set(12, out_elempack);

        gemm->load_param(pd);

        // maxk-inch-outch to pa-maxk-outch/pa-inch
        Mat tmp;
        {
            Mat weight_data_r2 = weight_data.reshape(maxk, num_input, num_output);

            tmp.create(maxk * num_output, num_input);

            for (int p = 0; p < num_input; p += 1)
            {
                float* g00 = tmp.row(p);

                for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        for (int i = 0; i < out_elempack; i++)
                        {
                            const float* k00 = weight_data_r2.channel(q + i).row(p);
                            g00[0] = k00[k];
                            g00++;
                        }
                    }
                }
            }
        }

        ncnn::Mat weights[1];
        weights[0] = tmp;

        gemm->load_model(ModelBinFromMatArray(weights));

        gemm->create_pipeline(opt);
    }
    else
    {
        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < num_input * num_output; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

        // src = kw-kh-inch-outch
        // dst = pb-pa-kw-kh-inch/pa-outch/pb
        Mat weight_data_r2 = weight_data_transposed.reshape(maxk, num_input, num_output);

        weight_data_tm.create(maxk, num_input / elempack, num_output / out_elempack, (size_t)4u * elempack * out_elempack, elempack * out_elempack);

        for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
        {
            float* g00 = weight_data_tm.channel(q / out_elempack);

            for (int p = 0; p + (elempack - 1) < num_input; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        for (int j = 0; j < out_elempack; j++)
                        {
                            const float* k00 = weight_data_r2.channel(q + j).row(p + i);

                            g00[0] = k00[k];

                            g00++;
                        }
                    }
                }
            }
        }
    }

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}